

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O2

void __thiscall
btSliderConstraint::btSliderConstraint
          (btSliderConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *frameInA,
          btTransform *frameInB,bool useLinearReferenceFrameA)

{
  undefined8 uVar1;
  
  btTypedConstraint::btTypedConstraint
            (&this->super_btTypedConstraint,SLIDER_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1648;
  this->m_useSolveConstraintObsolete = false;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = *(undefined8 *)(frameInA->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar1;
  this->m_useLinearReferenceFrameA = useLinearReferenceFrameA;
  initParams(this);
  return;
}

Assistant:

btSliderConstraint::btSliderConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, bool useLinearReferenceFrameA)
        : btTypedConstraint(SLIDER_CONSTRAINT_TYPE, rbA, rbB),
		m_useSolveConstraintObsolete(false),
		m_frameInA(frameInA),
        m_frameInB(frameInB),
		m_useLinearReferenceFrameA(useLinearReferenceFrameA)
{
	initParams();
}